

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QMakeLocalFileName>::relocate
          (QArrayDataPointer<QMakeLocalFileName> *this,qsizetype offset,QMakeLocalFileName **data)

{
  bool bVar1;
  QMakeLocalFileName *in_RDX;
  long in_RSI;
  QMakeLocalFileName *in_RDI;
  QMakeLocalFileName **unaff_retaddr;
  QMakeLocalFileName *res;
  char16_t *n;
  QMakeLocalFileName *c;
  
  n = (in_RDI->real_name).d.ptr + in_RSI * 0x18;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<QMakeLocalFileName,long_long>(in_RDX,(longlong)n,in_RDI);
  if ((in_RDX != (QMakeLocalFileName *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<QMakeLocalFileName>,QMakeLocalFileName_const*>
                        (unaff_retaddr,(QArrayDataPointer<QMakeLocalFileName> *)c), bVar1)) {
    (in_RDX->real_name).d.d = (in_RDX->real_name).d.d + in_RSI * 3;
  }
  (in_RDI->real_name).d.ptr = n;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }